

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cryptor.c
# Opt level: O0

int aes_ctr_update(archive_crypto_ctx *ctx,uint8_t *in,size_t in_len,uint8_t *out,size_t *out_len)

{
  uint uVar1;
  int iVar2;
  size_t local_58;
  uint local_4c;
  uint i;
  uint max;
  uint pos;
  uint8_t *ebuf;
  size_t *out_len_local;
  uint8_t *out_local;
  size_t in_len_local;
  uint8_t *in_local;
  archive_crypto_ctx *ctx_local;
  
  local_58 = in_len;
  if (*out_len <= in_len) {
    local_58 = *out_len;
  }
  uVar1 = (uint)local_58;
  i = ctx->encr_pos;
  for (local_4c = 0; local_4c < uVar1; local_4c = local_4c + 1) {
    if (i == 0x10) {
      aes_ctr_increase_counter(ctx);
      iVar2 = aes_ctr_encrypt_counter(ctx);
      if (iVar2 != 0) {
        return -1;
      }
      while (0xf < uVar1 - local_4c) {
        for (i = 0; i < 0x10; i = i + 1) {
          out[local_4c + i] = in[local_4c + i] ^ ctx->encr_buf[i];
        }
        local_4c = local_4c + 0x10;
        aes_ctr_increase_counter(ctx);
        iVar2 = aes_ctr_encrypt_counter(ctx);
        if (iVar2 != 0) {
          return -1;
        }
      }
      i = 0;
      if (uVar1 <= local_4c) break;
    }
    out[local_4c] = in[local_4c] ^ ctx->encr_buf[i];
    i = i + 1;
  }
  ctx->encr_pos = i;
  *out_len = (ulong)local_4c;
  return 0;
}

Assistant:

static int
aes_ctr_update(archive_crypto_ctx *ctx, const uint8_t * const in,
    size_t in_len, uint8_t * const out, size_t *out_len)
{
	uint8_t *const ebuf = ctx->encr_buf;
	unsigned pos = ctx->encr_pos;
	unsigned max = (unsigned)((in_len < *out_len)? in_len: *out_len);
	unsigned i;

	for (i = 0; i < max; ) {
		if (pos == AES_BLOCK_SIZE) {
			aes_ctr_increase_counter(ctx);
			if (aes_ctr_encrypt_counter(ctx) != 0)
				return -1;
			while (max -i >= AES_BLOCK_SIZE) {
				for (pos = 0; pos < AES_BLOCK_SIZE; pos++)
					out[i+pos] = in[i+pos] ^ ebuf[pos];
				i += AES_BLOCK_SIZE;
				aes_ctr_increase_counter(ctx);
				if (aes_ctr_encrypt_counter(ctx) != 0)
					return -1;
			}
			pos = 0;
			if (i >= max)
				break;
		}
		out[i] = in[i] ^ ebuf[pos++];
		i++;
	}
	ctx->encr_pos = pos;
	*out_len = i;

	return 0;
}